

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool cmsys::SystemTools::FileExists(char *filename,bool isFile)

{
  bool bVar1;
  allocator local_39;
  string local_38;
  
  bVar1 = FileExists(filename);
  if (isFile && bVar1) {
    std::__cxx11::string::string((string *)&local_38,filename,&local_39);
    bVar1 = FileIsDirectory(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool SystemTools::FileExists(const char* filename, bool isFile)
{
  if(SystemTools::FileExists(filename))
    {
    // If isFile is set return not FileIsDirectory,
    // so this will only be true if it is a file
    return !isFile || !SystemTools::FileIsDirectory(filename);
    }
  return false;
}